

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall pegmatite::ExprPtr::ExprPtr(ExprPtr *this,Rule *r)

{
  RuleReferenceExpr *this_00;
  Rule *r_local;
  ExprPtr *this_local;
  
  this_00 = (RuleReferenceExpr *)operator_new(0x10);
  anon_unknown.dwarf_50a29::RuleReferenceExpr::RuleReferenceExpr(this_00,r);
  std::shared_ptr<pegmatite::Expr>::shared_ptr<(anonymous_namespace)::RuleReferenceExpr,void>
            (&this->super_shared_ptr<pegmatite::Expr>,this_00);
  return;
}

Assistant:

ExprPtr::ExprPtr(const Rule &r) : std::shared_ptr<Expr>(new RuleReferenceExpr(r)) {}